

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

char * strnstr(char *s1,char *s2,size_t len)

{
  int iVar1;
  size_t __n;
  
  __n = strlen(s2);
  if (__n != 0) {
    if (__n <= len) {
      do {
        iVar1 = bcmp(s1,s2,__n);
        if (iVar1 == 0) {
          return s1;
        }
        len = len - 1;
        s1 = s1 + 1;
      } while (__n <= len);
    }
    s1 = (char *)0x0;
  }
  return s1;
}

Assistant:

char* strnstr(char* s1, const char* s2, const size_t len)
{
    size_t l1 = len;
    const size_t l2 = strlen(s2);
    if (!l2)
        return s1;
    while (l1 >= l2)
    {
        l1--;
        if (!memcmp(s1, s2, l2))
            return s1;
        s1++;
    }
    return nullptr;
}